

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spgmr.c
# Opt level: O1

int SUNSPGMRSetGSType(SUNLinearSolver S,int gstype)

{
  int iVar1;
  
  iVar1 = -2;
  if (0xfffffffd < gstype - 3U) {
    if (S != (SUNLinearSolver)0x0) {
      *(int *)((long)S->content + 8) = gstype;
      return 0;
    }
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

SUNDIALS_EXPORT int SUNLinSol_SPGMRSetGSType(SUNLinearSolver S, int gstype)
{
  /* Check for legal gstype */ 
  if ((gstype != MODIFIED_GS) && (gstype != CLASSICAL_GS)) {
    return(SUNLS_ILL_INPUT);
  }

  /* Check for non-NULL SUNLinearSolver */
  if (S == NULL) return(SUNLS_MEM_NULL);

  /* Set pretype */
  SPGMR_CONTENT(S)->gstype = gstype;
  return(SUNLS_SUCCESS);
}